

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_SetUnlockingScript_bytedata_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_bytedata_Test *this)

{
  uint32_t sequence;
  uint32_t index;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2b0;
  Message local_2a8;
  AbstractTxInReference local_2a0;
  Script local_210;
  string local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  Message local_1a0;
  allocator local_191;
  string local_190;
  ByteData local_170;
  AssertHelper local_158;
  Message local_150 [2];
  CfdException *anon_var_0;
  char *pcStack_138;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> bytedatas;
  string local_110;
  Script local_f0;
  allocator local_a1;
  string local_a0;
  Txid local_80;
  undefined1 local_60 [8];
  Transaction tx;
  uint32_t seq;
  uint32_t vout;
  uint32_t locktime;
  int32_t version;
  AbstractTransaction_SetUnlockingScript_bytedata_Test *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  cfd::core::Transaction::Transaction((Transaction *)local_60,2,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             &local_a1);
  cfd::core::Txid::Txid(&local_80,&local_a0);
  index = tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sequence = (uint32_t)
             tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",
             (allocator *)
             ((long)&bytedatas.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&local_f0,&local_110);
  cfd::core::Transaction::AddTxIn((Transaction *)local_60,&local_80,index,sequence,&local_f0);
  cfd::core::Script::~Script(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bytedatas.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Txid::~Txid(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffec8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffec8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetUnlockingScript
                ((Transaction *)local_60,3,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_002c536a;
    pcStack_138 = 
    "Expected: tx.SetUnlockingScript(3, bytedatas) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xb0,pcStack_138);
  testing::internal::AssertHelper::operator=(&local_158,local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::Message::~Message(local_150);
LAB_002c536a:
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763",&local_191);
  cfd::core::ByteData::ByteData(&local_170,&local_190);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg,
             &local_170);
  cfd::core::ByteData::~ByteData(&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetUnlockingScript
                ((Transaction *)local_60,0,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg);
    }
  }
  else {
    testing::Message::Message(&local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb6,
               "Expected: tx.SetUnlockingScript(0, bytedatas) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1a0);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_2a0,(Transaction *)local_60,0);
  cfd::core::AbstractTxInReference::GetUnlockingScript(&local_210,&local_2a0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1d8,&local_210);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b8,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",pcVar2,
             "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  std::__cxx11::string::~string((string *)&local_1d8);
  cfd::core::Script::~Script(&local_210);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg);
  cfd::core::Transaction::~Transaction((Transaction *)local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript_bytedata) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  std::vector<ByteData> bytedatas;
  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);

  bytedatas.push_back(
      ByteData(
          "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"));

  EXPECT_NO_THROW(tx.SetUnlockingScript(0, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}